

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

parameter * __thiscall
clipp::value<float&>(parameter *__return_storage_ptr__,clipp *this,doc_string *label,float *tgts)

{
  parameter *ppVar1;
  match_predicate local_140;
  parameter local_120;
  doc_string *local_20;
  float *tgts_local;
  doc_string *label_local;
  
  local_20 = label;
  tgts_local = (float *)this;
  label_local = (doc_string *)__return_storage_ptr__;
  std::function<bool(std::__cxx11::string_const&)>::
  function<bool(&)(std::__cxx11::string_const&),void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_140,match::nonempty);
  parameter::parameter(&local_120,&local_140);
  ppVar1 = parameter::label(&local_120,(doc_string *)tgts_local);
  ppVar1 = detail::action_provider<clipp::parameter>::target<float,void>
                     (&ppVar1->super_action_provider<clipp::parameter>,(float *)local_20);
  ppVar1 = parameter::required(ppVar1,true);
  ppVar1 = detail::token<clipp::parameter>::blocking(&ppVar1->super_token<clipp::parameter>,true);
  ppVar1 = detail::token<clipp::parameter>::repeatable(&ppVar1->super_token<clipp::parameter>,false)
  ;
  parameter::parameter(__return_storage_ptr__,ppVar1);
  parameter::~parameter(&local_120);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_140);
  return __return_storage_ptr__;
}

Assistant:

inline parameter
value(const doc_string& label, Targets&&... tgts)
{
    return parameter{match::nonempty}
        .label(label)
        .target(std::forward<Targets>(tgts)...)
        .required(true).blocking(true).repeatable(false);
}